

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> * __thiscall
Corrade::Utility::Path::anon_unknown_25::readInternal
          (Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>
           *__return_storage_ptr__,anon_unknown_25 *this,StringView filename,size_t extra)

{
  StringView value;
  StringView value_00;
  bool bVar1;
  int fd;
  char *pcVar2;
  FILE *handle;
  Debug *pDVar3;
  int *piVar4;
  type *this_00;
  unsigned_long *puVar5;
  size_t sVar6;
  ostream *output;
  Array<char,_void_(*)(char_*,_unsigned_long)> *value_01;
  ArrayView<char> AVar7;
  Array<char,_void_(*)(char_*,_unsigned_long)> local_1d0;
  Flags local_1b1;
  Error local_1b0;
  size_t local_188;
  size_t realSize;
  undefined1 local_178 [8];
  Array<char,_void_(*)(char_*,_unsigned_long)> out;
  ArrayView<char> local_158;
  size_t local_148;
  size_t count;
  size_t chunkSize;
  Array<char,_void_(*)(char_*,_unsigned_long)> out_1;
  Optional<unsigned_long> size_;
  Flags local_f1;
  Error local_f0;
  undefined1 local_c8 [8];
  ScopeGuard exit;
  Flags local_91;
  undefined1 local_90 [8];
  Error err;
  String local_48;
  FILE *local_30;
  FILE *f;
  size_t extra_local;
  StringView filename_local;
  
  f = (FILE *)filename._sizePlusFlags;
  filename_local._data = filename._data;
  extra_local = (size_t)this;
  filename_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  Containers::String::nullTerminatedView(&local_48,(String *)this,filename);
  pcVar2 = Containers::String::data(&local_48);
  handle = fopen(pcVar2,"rb");
  Containers::String::~String(&local_48);
  local_30 = handle;
  if (handle == (FILE *)0x0) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_91);
    Error::Error((Error *)local_90,local_91);
    pDVar3 = Debug::operator<<((Debug *)local_90,"Utility::Path::read(): can\'t open");
    value_00._sizePlusFlags = (size_t)filename_local._data;
    value_00._data = (char *)extra_local;
    pDVar3 = Debug::operator<<(pDVar3,value_00);
    pDVar3 = Debug::operator<<(pDVar3,Debug::nospace);
    Debug::operator<<(pDVar3,":");
    piVar4 = __errno_location();
    Implementation::printErrnoErrorString((Debug *)local_90,*piVar4);
    Containers::Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>::
    Optional(__return_storage_ptr__);
    Error::~Error((Error *)local_90);
  }
  else {
    Containers::ScopeGuard::ScopeGuard<_IO_FILE*,int(*)(_IO_FILE*)>
              ((ScopeGuard *)local_c8,(_IO_FILE *)handle,fclose);
    fd = fileno(local_30);
    bVar1 = isDirectory(fd);
    if (bVar1) {
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_f1);
      Error::Error(&local_f0,local_f1);
      pDVar3 = Debug::operator<<(&local_f0.super_Debug,"Utility::Path::read():");
      value._sizePlusFlags = (size_t)filename_local._data;
      value._data = (char *)extra_local;
      pDVar3 = Debug::operator<<(pDVar3,value);
      Debug::operator<<(pDVar3,"is a directory");
      Error::~Error(&local_f0);
      Containers::Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>::
      Optional(__return_storage_ptr__);
    }
    else {
      size((anon_unknown_25 *)&out_1._deleter,(FILE *)local_30);
      bVar1 = Containers::Optional::operator_cast_to_bool((Optional *)&out_1._deleter);
      if (bVar1) {
        puVar5 = Containers::Optional<unsigned_long>::operator*
                           ((Optional<unsigned_long> *)&out_1._deleter);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::Array
                  ((Array<char,_void_(*)(char_*,_unsigned_long)> *)local_178,f + *puVar5);
        pcVar2 = Containers::Array::operator_cast_to_char_((Array *)local_178);
        puVar5 = Containers::Optional<unsigned_long>::operator*
                           ((Optional<unsigned_long> *)&out_1._deleter);
        sVar6 = fread(pcVar2,1,*puVar5,local_30);
        local_188 = sVar6;
        puVar5 = Containers::Optional<unsigned_long>::operator*
                           ((Optional<unsigned_long> *)&out_1._deleter);
        if (*puVar5 < sVar6) {
          output = Error::defaultOutput();
          Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                    (&local_1b1);
          Error::Error(&local_1b0,output,local_1b1);
          Debug::operator<<(&local_1b0.super_Debug,
                            "Assertion realSize <= *size_ failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Path.cpp:1143"
                           );
          Error::~Error(&local_1b0);
          abort();
        }
        pcVar2 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::release
                           ((Array<char,_void_(*)(char_*,_unsigned_long)> *)local_178);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::Array
                  (&local_1d0,pcVar2,local_188,(_func_void_char_ptr_unsigned_long *)0x0);
        Containers::Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>::
        Optional(__return_storage_ptr__,&local_1d0);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array(&local_1d0);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
                  ((Array<char,_void_(*)(char_*,_unsigned_long)> *)local_178);
      }
      else {
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::Array
                  ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&chunkSize);
        count = 0x1000;
        do {
          AVar7 = Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                            (&chunkSize,f + 0x1000);
          local_158 = AVar7;
          pcVar2 = Containers::ArrayView::operator_cast_to_char_((ArrayView *)&local_158);
          local_148 = fread(pcVar2,1,0x1000,local_30);
          Containers::arrayRemoveSuffix<char,Corrade::Containers::ArrayMallocAllocator<char>>
                    ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&chunkSize,
                     (size_t)(f + (0x1000 - local_148)));
        } while (local_148 != 0);
        this_00 = move<Corrade::Containers::Array<char,void(*)(char*,unsigned_long)>&>
                            ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&chunkSize);
        Containers::optional<Corrade::Containers::Array<char,void(*)(char*,unsigned_long)>>
                  (__return_storage_ptr__,(Containers *)this_00,value_01);
        Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
                  ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&chunkSize);
      }
      Containers::Optional<unsigned_long>::~Optional((Optional<unsigned_long> *)&out_1._deleter);
    }
    Containers::ScopeGuard::~ScopeGuard((ScopeGuard *)local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::Array<char>> readInternal(const Containers::StringView filename, std::size_t extra) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "rb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"rb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::read(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return {};
    }

    Containers::ScopeGuard exit{f, std::fclose};

    #if defined(CORRADE_TARGET_UNIX) || defined(CORRADE_TARGET_EMSCRIPTEN)
    /* Explicitly fail if opening directories for reading on Unix to prevent
       allocation failures or silent errors, see isDirectory(int) for details.
       On Windows the fopen() fails already. */
    if(isDirectory(fileno(f))) {
        Error{} << "Utility::Path::read():" << filename << "is a directory";
        return {};
    }
    #endif

    Containers::Optional<std::size_t> size_ = size(f);

    /* If the file is not seekable, read it in chunks. Read directly into the
       output array --- each time add uninitialized 4 kB at the end, pass that
       view to fread(), and then strip away what didn't get filled. Hey, do you
       like the growable array API as much as I do? :D */
    /** @todo that the loop works is only verifiable by setting the condition
        to if(true) and setting chunkSize to 1 -- I don't know about any large
        non-seekable file that could be used for this */
    if(!size_) {
        Containers::Array<char> out;
        constexpr std::size_t chunkSize = 4096;

        std::size_t count;
        do {
            count = std::fread(arrayAppend(out, NoInit, chunkSize + extra), 1, chunkSize, f);
            arrayRemoveSuffix(out, chunkSize + extra - count);
        } while(count);

        /* GCC 4.8 needs extra help here */
        return Containers::optional(Utility::move(out));
    }

    /* Some special files report more bytes than they actually have (such as
       stuff in /sys). Clamp the returned array to what was reported. */
    Containers::Array<char> out{NoInit, *size_ + extra};
    const std::size_t realSize = std::fread(out, 1, *size_, f);
    CORRADE_INTERNAL_ASSERT(realSize <= *size_);
    return Containers::Array<char>{out.release(), realSize};
}